

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  int iVar3;
  float fVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  ulong uVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  NodeRef *pNVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 extraout_var [56];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  UVIdentity<4> mapUV;
  undefined1 local_1598 [16];
  long local_1588;
  ulong local_1580;
  long local_1578;
  undefined1 (*local_1570) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  float local_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  UVIdentity<4> *local_1448;
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  RTCHitN local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  uint local_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  uint uStack_1340;
  uint uStack_133c;
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  pNVar39 = stack + 1;
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar77 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(uVar2
                                                  ,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar84 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(uVar2
                                                  ,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar88 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(uVar2
                                                  ,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  local_12b8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_12d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_12f8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1258 = local_12b8 * 0.99999964;
  local_1278 = local_12d8 * 0.99999964;
  local_1298 = local_12f8 * 0.99999964;
  local_12b8 = local_12b8 * 1.0000004;
  local_12d8 = local_12d8 * 1.0000004;
  local_12f8 = local_12f8 * 1.0000004;
  local_1580 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar42 = local_1580 ^ 0x20;
  iVar3 = (tray->tnear).field_0.i[k];
  auVar93 = ZEXT3264(CONCAT428(iVar3,CONCAT424(iVar3,CONCAT420(iVar3,CONCAT416(iVar3,CONCAT412(iVar3
                                                  ,CONCAT48(iVar3,CONCAT44(iVar3,iVar3))))))));
  iVar3 = (tray->tfar).field_0.i[k];
  auVar96 = ZEXT3264(CONCAT428(iVar3,CONCAT424(iVar3,CONCAT420(iVar3,CONCAT416(iVar3,CONCAT412(iVar3
                                                  ,CONCAT48(iVar3,CONCAT44(iVar3,iVar3))))))));
  local_1570 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  bVar44 = true;
  fStack_12f4 = local_12f8;
  fStack_12f0 = local_12f8;
  fStack_12ec = local_12f8;
  fStack_12e8 = local_12f8;
  fStack_12e4 = local_12f8;
  fStack_12e0 = local_12f8;
  fStack_12dc = local_12f8;
  fStack_1274 = local_1278;
  fStack_1270 = local_1278;
  fStack_126c = local_1278;
  fStack_1268 = local_1278;
  fStack_1264 = local_1278;
  fStack_1260 = local_1278;
  fStack_125c = local_1278;
  fStack_1254 = local_1258;
  fStack_1250 = local_1258;
  fStack_124c = local_1258;
  fStack_1248 = local_1258;
  fStack_1244 = local_1258;
  fStack_1240 = local_1258;
  fStack_123c = local_1258;
  fStack_1294 = local_1298;
  fStack_1290 = local_1298;
  fStack_128c = local_1298;
  fStack_1288 = local_1298;
  fStack_1284 = local_1298;
  fStack_1280 = local_1298;
  fStack_127c = local_1298;
  fStack_12b4 = local_12b8;
  fStack_12b0 = local_12b8;
  fStack_12ac = local_12b8;
  fStack_12a8 = local_12b8;
  fStack_12a4 = local_12b8;
  fStack_12a0 = local_12b8;
  fStack_129c = local_12b8;
  fStack_12d4 = local_12d8;
  fStack_12d0 = local_12d8;
  fStack_12cc = local_12d8;
  fStack_12c8 = local_12d8;
  fStack_12c4 = local_12d8;
  fStack_12c0 = local_12d8;
  fStack_12bc = local_12d8;
  do {
    uVar38 = pNVar39[-1].ptr;
    pNVar39 = pNVar39 + -1;
    local_11f8 = auVar77._0_32_;
    local_1218 = auVar84._0_32_;
    local_1238 = auVar88._0_32_;
    while ((uVar38 & 8) == 0) {
      auVar26 = vsubps_avx(*(undefined1 (*) [32])(uVar38 + 0x40 + local_1580),local_11f8);
      auVar27._4_4_ = fStack_1254 * auVar26._4_4_;
      auVar27._0_4_ = local_1258 * auVar26._0_4_;
      auVar27._8_4_ = fStack_1250 * auVar26._8_4_;
      auVar27._12_4_ = fStack_124c * auVar26._12_4_;
      auVar27._16_4_ = fStack_1248 * auVar26._16_4_;
      auVar27._20_4_ = fStack_1244 * auVar26._20_4_;
      auVar27._24_4_ = fStack_1240 * auVar26._24_4_;
      auVar27._28_4_ = auVar26._28_4_;
      auVar26 = vsubps_avx(*(undefined1 (*) [32])(uVar38 + 0x40 + uVar40),local_1218);
      auVar28._4_4_ = fStack_1274 * auVar26._4_4_;
      auVar28._0_4_ = local_1278 * auVar26._0_4_;
      auVar28._8_4_ = fStack_1270 * auVar26._8_4_;
      auVar28._12_4_ = fStack_126c * auVar26._12_4_;
      auVar28._16_4_ = fStack_1268 * auVar26._16_4_;
      auVar28._20_4_ = fStack_1264 * auVar26._20_4_;
      auVar28._24_4_ = fStack_1260 * auVar26._24_4_;
      auVar28._28_4_ = auVar26._28_4_;
      auVar26 = vmaxps_avx(auVar27,auVar28);
      auVar27 = vsubps_avx(*(undefined1 (*) [32])(uVar38 + 0x40 + uVar41),local_1238);
      auVar29._4_4_ = fStack_1294 * auVar27._4_4_;
      auVar29._0_4_ = local_1298 * auVar27._0_4_;
      auVar29._8_4_ = fStack_1290 * auVar27._8_4_;
      auVar29._12_4_ = fStack_128c * auVar27._12_4_;
      auVar29._16_4_ = fStack_1288 * auVar27._16_4_;
      auVar29._20_4_ = fStack_1284 * auVar27._20_4_;
      auVar29._24_4_ = fStack_1280 * auVar27._24_4_;
      auVar29._28_4_ = auVar27._28_4_;
      auVar27 = vmaxps_avx(auVar29,auVar93._0_32_);
      auVar26 = vmaxps_avx(auVar26,auVar27);
      auVar27 = vsubps_avx(*(undefined1 (*) [32])(uVar38 + 0x40 + uVar42),local_11f8);
      auVar30._4_4_ = fStack_12b4 * auVar27._4_4_;
      auVar30._0_4_ = local_12b8 * auVar27._0_4_;
      auVar30._8_4_ = fStack_12b0 * auVar27._8_4_;
      auVar30._12_4_ = fStack_12ac * auVar27._12_4_;
      auVar30._16_4_ = fStack_12a8 * auVar27._16_4_;
      auVar30._20_4_ = fStack_12a4 * auVar27._20_4_;
      auVar30._24_4_ = fStack_12a0 * auVar27._24_4_;
      auVar30._28_4_ = auVar27._28_4_;
      auVar27 = vsubps_avx(*(undefined1 (*) [32])(uVar38 + 0x40 + (uVar40 ^ 0x20)),local_1218);
      auVar31._4_4_ = fStack_12d4 * auVar27._4_4_;
      auVar31._0_4_ = local_12d8 * auVar27._0_4_;
      auVar31._8_4_ = fStack_12d0 * auVar27._8_4_;
      auVar31._12_4_ = fStack_12cc * auVar27._12_4_;
      auVar31._16_4_ = fStack_12c8 * auVar27._16_4_;
      auVar31._20_4_ = fStack_12c4 * auVar27._20_4_;
      auVar31._24_4_ = fStack_12c0 * auVar27._24_4_;
      auVar31._28_4_ = auVar27._28_4_;
      auVar27 = vminps_avx(auVar30,auVar31);
      auVar28 = vsubps_avx(*(undefined1 (*) [32])(uVar38 + 0x40 + (uVar41 ^ 0x20)),local_1238);
      auVar32._4_4_ = fStack_12f4 * auVar28._4_4_;
      auVar32._0_4_ = local_12f8 * auVar28._0_4_;
      auVar32._8_4_ = fStack_12f0 * auVar28._8_4_;
      auVar32._12_4_ = fStack_12ec * auVar28._12_4_;
      auVar32._16_4_ = fStack_12e8 * auVar28._16_4_;
      auVar32._20_4_ = fStack_12e4 * auVar28._20_4_;
      auVar32._24_4_ = fStack_12e0 * auVar28._24_4_;
      auVar32._28_4_ = auVar28._28_4_;
      auVar28 = vminps_avx(auVar32,auVar96._0_32_);
      auVar27 = vminps_avx(auVar27,auVar28);
      auVar26 = vcmpps_avx(auVar26,auVar27,2);
      uVar35 = vmovmskps_avx(auVar26);
      if (uVar35 == 0) goto LAB_005cc882;
      uVar33 = uVar38 & 0xfffffffffffffff0;
      lVar34 = 0;
      for (uVar38 = (ulong)(byte)uVar35; (uVar38 & 1) == 0;
          uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar34 = lVar34 + 1;
      }
      uVar38 = *(ulong *)(uVar33 + lVar34 * 8);
      uVar35 = (uVar35 & 0xff) - 1 & uVar35 & 0xff;
      uVar36 = (ulong)uVar35;
      if (uVar35 != 0) {
        pNVar39->ptr = uVar38;
        lVar34 = 0;
        for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
          lVar34 = lVar34 + 1;
        }
        uVar35 = uVar35 - 1 & uVar35;
        uVar36 = (ulong)uVar35;
        bVar43 = uVar35 == 0;
        while( true ) {
          pNVar39 = pNVar39 + 1;
          uVar38 = *(ulong *)(uVar33 + lVar34 * 8);
          if (bVar43) break;
          pNVar39->ptr = uVar38;
          lVar34 = 0;
          for (uVar38 = uVar36; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar36 = uVar36 - 1 & uVar36;
          bVar43 = uVar36 == 0;
        }
      }
    }
    local_1588 = (ulong)((uint)uVar38 & 0xf) - 8;
    if (local_1588 != 0) {
      uVar38 = uVar38 & 0xfffffffffffffff0;
      local_1578 = 0;
      local_1318 = auVar93._0_32_;
      local_1338 = auVar96._0_32_;
      do {
        lVar34 = local_1578 * 0x50;
        pSVar6 = context->scene;
        ppfVar7 = (pSVar6->vertices).items;
        pfVar8 = ppfVar7[*(uint *)(uVar38 + 0x30 + lVar34)];
        pfVar9 = ppfVar7[*(uint *)(uVar38 + 0x34 + lVar34)];
        pfVar10 = ppfVar7[*(uint *)(uVar38 + 0x38 + lVar34)];
        pfVar11 = ppfVar7[*(uint *)(uVar38 + 0x3c + lVar34)];
        auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + lVar34)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar38 + 8 + lVar34)));
        auVar69 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + lVar34)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar38 + 8 + lVar34)));
        auVar83 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar38 + 4 + lVar34)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar38 + 0xc + lVar34)));
        auVar79 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar38 + 4 + lVar34)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar38 + 0xc + lVar34)));
        auVar57 = vunpcklps_avx(auVar69,auVar79);
        auVar90 = vunpcklps_avx(auVar56,auVar83);
        auVar69 = vunpckhps_avx(auVar56,auVar83);
        auVar83 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0x10 + lVar34)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar38 + 0x18 + lVar34)))
        ;
        auVar79 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0x10 + lVar34)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar38 + 0x18 + lVar34)))
        ;
        auVar92 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar38 + 0x14 + lVar34)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar38 + 0x1c + lVar34)))
        ;
        auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar38 + 0x14 + lVar34)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar38 + 0x1c + lVar34)))
        ;
        auVar50 = vunpcklps_avx(auVar79,auVar56);
        auVar66 = vunpcklps_avx(auVar83,auVar92);
        auVar56 = vunpckhps_avx(auVar83,auVar92);
        auVar92 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0x20 + lVar34)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar38 + 0x28 + lVar34)))
        ;
        auVar79 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0x20 + lVar34)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar38 + 0x28 + lVar34)))
        ;
        auVar65 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar38 + 0x24 + lVar34)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar38 + 0x2c + lVar34)))
        ;
        auVar83 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar38 + 0x24 + lVar34)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar38 + 0x2c + lVar34)))
        ;
        auVar76 = vunpcklps_avx(auVar79,auVar83);
        auVar91 = vunpcklps_avx(auVar92,auVar65);
        auVar65 = vunpckhps_avx(auVar92,auVar65);
        puVar1 = (undefined8 *)(uVar38 + 0x30 + lVar34);
        local_1488 = *puVar1;
        uStack_1480 = puVar1[1];
        puVar1 = (undefined8 *)(uVar38 + 0x40 + lVar34);
        local_1498 = *puVar1;
        uStack_1490 = puVar1[1];
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar92._4_4_ = uVar2;
        auVar92._0_4_ = uVar2;
        auVar92._8_4_ = uVar2;
        auVar92._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar94._4_4_ = uVar2;
        auVar94._0_4_ = uVar2;
        auVar94._8_4_ = uVar2;
        auVar94._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar97._4_4_ = uVar2;
        auVar97._0_4_ = uVar2;
        auVar97._8_4_ = uVar2;
        auVar97._12_4_ = uVar2;
        auVar83 = vsubps_avx(auVar90,auVar92);
        auVar90 = vsubps_avx(auVar69,auVar94);
        auVar69 = vsubps_avx(auVar57,auVar97);
        auVar79 = vsubps_avx(auVar66,auVar92);
        auVar56 = vsubps_avx(auVar56,auVar94);
        auVar57 = vsubps_avx(auVar50,auVar97);
        auVar92 = vsubps_avx(auVar91,auVar92);
        auVar65 = vsubps_avx(auVar65,auVar94);
        auVar50 = vsubps_avx(auVar76,auVar97);
        auVar66 = vsubps_avx(auVar92,auVar83);
        auVar76 = vsubps_avx(auVar65,auVar90);
        auVar91 = vsubps_avx(auVar50,auVar69);
        auVar45._0_4_ = auVar92._0_4_ + auVar83._0_4_;
        auVar45._4_4_ = auVar92._4_4_ + auVar83._4_4_;
        auVar45._8_4_ = auVar92._8_4_ + auVar83._8_4_;
        auVar45._12_4_ = auVar92._12_4_ + auVar83._12_4_;
        auVar63._0_4_ = auVar65._0_4_ + auVar90._0_4_;
        auVar63._4_4_ = auVar65._4_4_ + auVar90._4_4_;
        auVar63._8_4_ = auVar65._8_4_ + auVar90._8_4_;
        auVar63._12_4_ = auVar65._12_4_ + auVar90._12_4_;
        fVar14 = auVar69._0_4_;
        auVar67._0_4_ = auVar50._0_4_ + fVar14;
        fVar15 = auVar69._4_4_;
        auVar67._4_4_ = auVar50._4_4_ + fVar15;
        fVar16 = auVar69._8_4_;
        auVar67._8_4_ = auVar50._8_4_ + fVar16;
        fVar17 = auVar69._12_4_;
        auVar67._12_4_ = auVar50._12_4_ + fVar17;
        auVar95._0_4_ = auVar91._0_4_ * auVar63._0_4_;
        auVar95._4_4_ = auVar91._4_4_ * auVar63._4_4_;
        auVar95._8_4_ = auVar91._8_4_ * auVar63._8_4_;
        auVar95._12_4_ = auVar91._12_4_ * auVar63._12_4_;
        auVar94 = vfmsub231ps_fma(auVar95,auVar76,auVar67);
        auVar68._0_4_ = auVar66._0_4_ * auVar67._0_4_;
        auVar68._4_4_ = auVar66._4_4_ * auVar67._4_4_;
        auVar68._8_4_ = auVar66._8_4_ * auVar67._8_4_;
        auVar68._12_4_ = auVar66._12_4_ * auVar67._12_4_;
        auVar67 = vfmsub231ps_fma(auVar68,auVar91,auVar45);
        auVar46._0_4_ = auVar76._0_4_ * auVar45._0_4_;
        auVar46._4_4_ = auVar76._4_4_ * auVar45._4_4_;
        auVar46._8_4_ = auVar76._8_4_ * auVar45._8_4_;
        auVar46._12_4_ = auVar76._12_4_ * auVar45._12_4_;
        auVar45 = vfmsub231ps_fma(auVar46,auVar66,auVar63);
        fVar4 = *(float *)(ray + k * 4 + 0x60);
        auVar64._0_4_ = fVar4 * auVar45._0_4_;
        auVar64._4_4_ = fVar4 * auVar45._4_4_;
        auVar64._8_4_ = fVar4 * auVar45._8_4_;
        auVar64._12_4_ = fVar4 * auVar45._12_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar89._4_4_ = uVar2;
        auVar89._0_4_ = uVar2;
        auVar89._8_4_ = uVar2;
        auVar89._12_4_ = uVar2;
        auVar67 = vfmadd231ps_fma(auVar64,auVar89,auVar67);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar98._4_4_ = uVar2;
        auVar98._0_4_ = uVar2;
        auVar98._8_4_ = uVar2;
        auVar98._12_4_ = uVar2;
        auVar63 = vfmadd231ps_fma(auVar67,auVar98,auVar94);
        auVar67 = vsubps_avx(auVar90,auVar56);
        auVar94 = vsubps_avx(auVar69,auVar57);
        auVar54._0_4_ = auVar90._0_4_ + auVar56._0_4_;
        auVar54._4_4_ = auVar90._4_4_ + auVar56._4_4_;
        auVar54._8_4_ = auVar90._8_4_ + auVar56._8_4_;
        auVar54._12_4_ = auVar90._12_4_ + auVar56._12_4_;
        auVar69._0_4_ = auVar57._0_4_ + fVar14;
        auVar69._4_4_ = auVar57._4_4_ + fVar15;
        auVar69._8_4_ = auVar57._8_4_ + fVar16;
        auVar69._12_4_ = auVar57._12_4_ + fVar17;
        fVar18 = auVar94._0_4_;
        auVar78._0_4_ = auVar54._0_4_ * fVar18;
        fVar20 = auVar94._4_4_;
        auVar78._4_4_ = auVar54._4_4_ * fVar20;
        fVar22 = auVar94._8_4_;
        auVar78._8_4_ = auVar54._8_4_ * fVar22;
        fVar24 = auVar94._12_4_;
        auVar78._12_4_ = auVar54._12_4_ * fVar24;
        auVar46 = vfmsub231ps_fma(auVar78,auVar67,auVar69);
        auVar45 = vsubps_avx(auVar83,auVar79);
        fVar99 = auVar45._0_4_;
        auVar85._0_4_ = fVar99 * auVar69._0_4_;
        fVar100 = auVar45._4_4_;
        auVar85._4_4_ = fVar100 * auVar69._4_4_;
        fVar101 = auVar45._8_4_;
        auVar85._8_4_ = fVar101 * auVar69._8_4_;
        fVar102 = auVar45._12_4_;
        auVar85._12_4_ = fVar102 * auVar69._12_4_;
        auVar70._0_4_ = auVar83._0_4_ + auVar79._0_4_;
        auVar70._4_4_ = auVar83._4_4_ + auVar79._4_4_;
        auVar70._8_4_ = auVar83._8_4_ + auVar79._8_4_;
        auVar70._12_4_ = auVar83._12_4_ + auVar79._12_4_;
        auVar69 = vfmsub231ps_fma(auVar85,auVar94,auVar70);
        fVar19 = auVar67._0_4_;
        auVar71._0_4_ = auVar70._0_4_ * fVar19;
        fVar21 = auVar67._4_4_;
        auVar71._4_4_ = auVar70._4_4_ * fVar21;
        fVar23 = auVar67._8_4_;
        auVar71._8_4_ = auVar70._8_4_ * fVar23;
        fVar25 = auVar67._12_4_;
        auVar71._12_4_ = auVar70._12_4_ * fVar25;
        auVar49 = vfmsub231ps_fma(auVar71,auVar45,auVar54);
        auVar72._0_4_ = fVar4 * auVar49._0_4_;
        auVar72._4_4_ = fVar4 * auVar49._4_4_;
        auVar72._8_4_ = fVar4 * auVar49._8_4_;
        auVar72._12_4_ = fVar4 * auVar49._12_4_;
        auVar69 = vfmadd231ps_fma(auVar72,auVar89,auVar69);
        local_1468 = vfmadd231ps_fma(auVar69,auVar98,auVar46);
        auVar46 = vsubps_avx(auVar79,auVar92);
        auVar55._0_4_ = auVar79._0_4_ + auVar92._0_4_;
        auVar55._4_4_ = auVar79._4_4_ + auVar92._4_4_;
        auVar55._8_4_ = auVar79._8_4_ + auVar92._8_4_;
        auVar55._12_4_ = auVar79._12_4_ + auVar92._12_4_;
        auVar92 = vsubps_avx(auVar56,auVar65);
        auVar49._0_4_ = auVar56._0_4_ + auVar65._0_4_;
        auVar49._4_4_ = auVar56._4_4_ + auVar65._4_4_;
        auVar49._8_4_ = auVar56._8_4_ + auVar65._8_4_;
        auVar49._12_4_ = auVar56._12_4_ + auVar65._12_4_;
        auVar65 = vsubps_avx(auVar57,auVar50);
        auVar73._0_4_ = auVar57._0_4_ + auVar50._0_4_;
        auVar73._4_4_ = auVar57._4_4_ + auVar50._4_4_;
        auVar73._8_4_ = auVar57._8_4_ + auVar50._8_4_;
        auVar73._12_4_ = auVar57._12_4_ + auVar50._12_4_;
        auVar79._0_4_ = auVar65._0_4_ * auVar49._0_4_;
        auVar79._4_4_ = auVar65._4_4_ * auVar49._4_4_;
        auVar79._8_4_ = auVar65._8_4_ * auVar49._8_4_;
        auVar79._12_4_ = auVar65._12_4_ * auVar49._12_4_;
        auVar79 = vfmsub231ps_fma(auVar79,auVar92,auVar73);
        auVar74._0_4_ = auVar46._0_4_ * auVar73._0_4_;
        auVar74._4_4_ = auVar46._4_4_ * auVar73._4_4_;
        auVar74._8_4_ = auVar46._8_4_ * auVar73._8_4_;
        auVar74._12_4_ = auVar46._12_4_ * auVar73._12_4_;
        auVar69 = vfmsub231ps_fma(auVar74,auVar65,auVar55);
        auVar56._0_4_ = auVar92._0_4_ * auVar55._0_4_;
        auVar56._4_4_ = auVar92._4_4_ * auVar55._4_4_;
        auVar56._8_4_ = auVar92._8_4_ * auVar55._8_4_;
        auVar56._12_4_ = auVar92._12_4_ * auVar55._12_4_;
        auVar56 = vfmsub231ps_fma(auVar56,auVar46,auVar49);
        auVar57._0_4_ = fVar4 * auVar56._0_4_;
        auVar57._4_4_ = fVar4 * auVar56._4_4_;
        auVar57._8_4_ = fVar4 * auVar56._8_4_;
        auVar57._12_4_ = fVar4 * auVar56._12_4_;
        auVar69 = vfmadd231ps_fma(auVar57,auVar89,auVar69);
        auVar57 = vfmadd231ps_fma(auVar69,auVar98,auVar79);
        local_1478 = auVar63._0_4_;
        fStack_1474 = auVar63._4_4_;
        fStack_1470 = auVar63._8_4_;
        fStack_146c = auVar63._12_4_;
        local_1458._0_4_ = auVar57._0_4_ + local_1478 + local_1468._0_4_;
        local_1458._4_4_ = auVar57._4_4_ + fStack_1474 + local_1468._4_4_;
        local_1458._8_4_ = auVar57._8_4_ + fStack_1470 + local_1468._8_4_;
        local_1458._12_4_ = auVar57._12_4_ + fStack_146c + local_1468._12_4_;
        auVar50._8_4_ = 0x7fffffff;
        auVar50._0_8_ = 0x7fffffff7fffffff;
        auVar50._12_4_ = 0x7fffffff;
        auVar69 = vminps_avx(auVar63,local_1468);
        auVar79 = vminps_avx(auVar69,auVar57);
        auVar69 = vandps_avx(local_1458,auVar50);
        auVar86._0_4_ = auVar69._0_4_ * 1.1920929e-07;
        auVar86._4_4_ = auVar69._4_4_ * 1.1920929e-07;
        auVar86._8_4_ = auVar69._8_4_ * 1.1920929e-07;
        auVar86._12_4_ = auVar69._12_4_ * 1.1920929e-07;
        uVar33 = CONCAT44(auVar86._4_4_,auVar86._0_4_);
        auVar80._0_8_ = uVar33 ^ 0x8000000080000000;
        auVar80._8_4_ = -auVar86._8_4_;
        auVar80._12_4_ = -auVar86._12_4_;
        auVar79 = vcmpps_avx(auVar79,auVar80,5);
        auVar56 = vmaxps_avx(auVar63,local_1468);
        auVar56 = vmaxps_avx(auVar56,auVar57);
        auVar56 = vcmpps_avx(auVar56,auVar86,2);
        auVar79 = vorps_avx(auVar79,auVar56);
        if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar79[0xf] < '\0') {
          auVar58._0_4_ = fVar19 * auVar91._0_4_;
          auVar58._4_4_ = fVar21 * auVar91._4_4_;
          auVar58._8_4_ = fVar23 * auVar91._8_4_;
          auVar58._12_4_ = fVar25 * auVar91._12_4_;
          auVar75._0_4_ = fVar99 * auVar76._0_4_;
          auVar75._4_4_ = fVar100 * auVar76._4_4_;
          auVar75._8_4_ = fVar101 * auVar76._8_4_;
          auVar75._12_4_ = fVar102 * auVar76._12_4_;
          auVar76 = vfmsub213ps_fma(auVar76,auVar94,auVar58);
          auVar81._0_4_ = auVar92._0_4_ * fVar18;
          auVar81._4_4_ = auVar92._4_4_ * fVar20;
          auVar81._8_4_ = auVar92._8_4_ * fVar22;
          auVar81._12_4_ = auVar92._12_4_ * fVar24;
          auVar87._0_4_ = fVar99 * auVar65._0_4_;
          auVar87._4_4_ = fVar100 * auVar65._4_4_;
          auVar87._8_4_ = fVar101 * auVar65._8_4_;
          auVar87._12_4_ = fVar102 * auVar65._12_4_;
          auVar65 = vfmsub213ps_fma(auVar65,auVar67,auVar81);
          auVar56 = vandps_avx(auVar58,auVar50);
          auVar57 = vandps_avx(auVar81,auVar50);
          auVar56 = vcmpps_avx(auVar56,auVar57,1);
          local_13f8 = vblendvps_avx(auVar65,auVar76,auVar56);
          auVar82._0_4_ = auVar46._0_4_ * fVar19;
          auVar82._4_4_ = auVar46._4_4_ * fVar21;
          auVar82._8_4_ = auVar46._8_4_ * fVar23;
          auVar82._12_4_ = auVar46._12_4_ * fVar25;
          auVar65 = vfmsub213ps_fma(auVar46,auVar94,auVar87);
          auVar59._0_4_ = auVar66._0_4_ * fVar18;
          auVar59._4_4_ = auVar66._4_4_ * fVar20;
          auVar59._8_4_ = auVar66._8_4_ * fVar22;
          auVar59._12_4_ = auVar66._12_4_ * fVar24;
          auVar76 = vfmsub213ps_fma(auVar91,auVar45,auVar59);
          auVar56 = vandps_avx(auVar59,auVar50);
          auVar57 = vandps_avx(auVar87,auVar50);
          auVar56 = vcmpps_avx(auVar56,auVar57,1);
          local_13e8 = vblendvps_avx(auVar65,auVar76,auVar56);
          auVar65 = vfmsub213ps_fma(auVar66,auVar67,auVar75);
          auVar92 = vfmsub213ps_fma(auVar92,auVar45,auVar82);
          auVar56 = vandps_avx(auVar75,auVar50);
          auVar57 = vandps_avx(auVar82,auVar50);
          auVar56 = vcmpps_avx(auVar56,auVar57,1);
          local_13d8 = vblendvps_avx(auVar92,auVar65,auVar56);
          auVar65._0_4_ = local_13d8._0_4_ * fVar4;
          auVar65._4_4_ = local_13d8._4_4_ * fVar4;
          auVar65._8_4_ = local_13d8._8_4_ * fVar4;
          auVar65._12_4_ = local_13d8._12_4_ * fVar4;
          auVar56 = vfmadd213ps_fma(auVar89,local_13e8,auVar65);
          auVar56 = vfmadd213ps_fma(auVar98,local_13f8,auVar56);
          auVar76._0_4_ = auVar56._0_4_ + auVar56._0_4_;
          auVar76._4_4_ = auVar56._4_4_ + auVar56._4_4_;
          auVar76._8_4_ = auVar56._8_4_ + auVar56._8_4_;
          auVar76._12_4_ = auVar56._12_4_ + auVar56._12_4_;
          auVar66._0_4_ = local_13d8._0_4_ * fVar14;
          auVar66._4_4_ = local_13d8._4_4_ * fVar15;
          auVar66._8_4_ = local_13d8._8_4_ * fVar16;
          auVar66._12_4_ = local_13d8._12_4_ * fVar17;
          auVar56 = vfmadd213ps_fma(auVar90,local_13e8,auVar66);
          auVar83 = vfmadd213ps_fma(auVar83,local_13f8,auVar56);
          auVar56 = vrcpps_avx(auVar76);
          auVar90._8_4_ = 0x3f800000;
          auVar90._0_8_ = 0x3f8000003f800000;
          auVar90._12_4_ = 0x3f800000;
          auVar90 = vfnmadd213ps_fma(auVar56,auVar76,auVar90);
          auVar56 = vfmadd132ps_fma(auVar90,auVar56,auVar56);
          local_1408._0_4_ = (auVar83._0_4_ + auVar83._0_4_) * auVar56._0_4_;
          local_1408._4_4_ = (auVar83._4_4_ + auVar83._4_4_) * auVar56._4_4_;
          local_1408._8_4_ = (auVar83._8_4_ + auVar83._8_4_) * auVar56._8_4_;
          local_1408._12_4_ = (auVar83._12_4_ + auVar83._12_4_) * auVar56._12_4_;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar83._4_4_ = uVar2;
          auVar83._0_4_ = uVar2;
          auVar83._8_4_ = uVar2;
          auVar83._12_4_ = uVar2;
          auVar56 = vcmpps_avx(auVar83,local_1408,2);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar91._4_4_ = uVar2;
          auVar91._0_4_ = uVar2;
          auVar91._8_4_ = uVar2;
          auVar91._12_4_ = uVar2;
          auVar77 = ZEXT1664(auVar91);
          auVar83 = vcmpps_avx(local_1408,auVar91,2);
          auVar56 = vandps_avx(auVar56,auVar83);
          auVar83 = auVar79 & auVar56;
          if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar83[0xf] < '\0') {
            auVar79 = vandps_avx(auVar56,auVar79);
            auVar56 = vcmpps_avx(auVar76,_DAT_01f7aa10,4);
            local_1438 = vandps_avx(auVar79,auVar56);
            uVar35 = vmovmskps_avx(local_1438);
            if (uVar35 != 0) {
              local_1448 = &mapUV;
              auVar79 = vrcpps_avx(local_1458);
              auVar60._8_4_ = 0x3f800000;
              auVar60._0_8_ = 0x3f8000003f800000;
              auVar60._12_4_ = 0x3f800000;
              auVar56 = vfnmadd213ps_fma(local_1458,auVar79,auVar60);
              auVar79 = vfmadd132ps_fma(auVar56,auVar79,auVar79);
              auVar51._8_4_ = 0x219392ef;
              auVar51._0_8_ = 0x219392ef219392ef;
              auVar51._12_4_ = 0x219392ef;
              auVar69 = vcmpps_avx(auVar69,auVar51,5);
              auVar69 = vandps_avx(auVar79,auVar69);
              auVar47._0_4_ = local_1478 * auVar69._0_4_;
              auVar47._4_4_ = fStack_1474 * auVar69._4_4_;
              auVar47._8_4_ = fStack_1470 * auVar69._8_4_;
              auVar47._12_4_ = fStack_146c * auVar69._12_4_;
              local_1428 = vminps_avx(auVar47,auVar60);
              auVar48._0_4_ = auVar69._0_4_ * local_1468._0_4_;
              auVar48._4_4_ = auVar69._4_4_ * local_1468._4_4_;
              auVar48._8_4_ = auVar69._8_4_ * local_1468._8_4_;
              auVar48._12_4_ = auVar69._12_4_ * local_1468._12_4_;
              local_1418 = vminps_avx(auVar48,auVar60);
              uVar33 = (ulong)(uVar35 & 0xff);
              do {
                uVar36 = 0;
                for (uVar37 = uVar33; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000)
                {
                  uVar36 = uVar36 + 1;
                }
                uVar35 = *(uint *)((long)&local_1488 + uVar36 * 4);
                pGVar12 = (pSVar6->geometries).items[uVar35].ptr;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005cc898:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar44;
                  }
                  uVar37 = (ulong)(uint)((int)uVar36 * 4);
                  uVar2 = *(undefined4 *)(local_1428 + uVar37);
                  auVar52._4_4_ = uVar2;
                  auVar52._0_4_ = uVar2;
                  auVar52._8_4_ = uVar2;
                  auVar52._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_1418 + uVar37);
                  auVar61._4_4_ = uVar2;
                  auVar61._0_4_ = uVar2;
                  auVar61._8_4_ = uVar2;
                  auVar61._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar37);
                  args.context = context->user;
                  local_1368._4_4_ = uVar35;
                  local_1368._0_4_ = uVar35;
                  local_1368._8_4_ = uVar35;
                  local_1368._12_4_ = uVar35;
                  uVar2 = *(undefined4 *)((long)&local_1498 + uVar37);
                  local_1378._4_4_ = uVar2;
                  local_1378._0_4_ = uVar2;
                  local_1378._8_4_ = uVar2;
                  local_1378._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_13f8 + uVar37);
                  uVar5 = *(undefined4 *)(local_13e8 + uVar37);
                  local_13b8._4_4_ = uVar5;
                  local_13b8._0_4_ = uVar5;
                  local_13b8._8_4_ = uVar5;
                  local_13b8._12_4_ = uVar5;
                  uVar5 = *(undefined4 *)(local_13d8 + uVar37);
                  local_13a8._4_4_ = uVar5;
                  local_13a8._0_4_ = uVar5;
                  local_13a8._8_4_ = uVar5;
                  local_13a8._12_4_ = uVar5;
                  local_13c8[0] = (RTCHitN)(char)uVar2;
                  local_13c8[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[4] = (RTCHitN)(char)uVar2;
                  local_13c8[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[8] = (RTCHitN)(char)uVar2;
                  local_13c8[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[0xc] = (RTCHitN)(char)uVar2;
                  local_13c8[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1398 = auVar52;
                  local_1388 = auVar61;
                  vpcmpeqd_avx2(ZEXT1632(local_1368),ZEXT1632(local_1368));
                  uStack_1354 = (args.context)->instID[0];
                  local_1358 = uStack_1354;
                  uStack_1350 = uStack_1354;
                  uStack_134c = uStack_1354;
                  uStack_1348 = (args.context)->instPrimID[0];
                  uStack_1344 = uStack_1348;
                  uStack_1340 = uStack_1348;
                  uStack_133c = uStack_1348;
                  local_1598 = *local_1570;
                  args.valid = (int *)local_1598;
                  args.geometryUserPtr = pGVar12->userPtr;
                  args.hit = local_13c8;
                  args.N = 4;
                  auVar69 = auVar77._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&args);
                    auVar77._8_56_ = extraout_var;
                    auVar77._0_8_ = extraout_XMM1_Qa;
                    auVar52 = auVar77._0_16_;
                    auVar77 = ZEXT1664(auVar69);
                  }
                  if (local_1598 == (undefined1  [16])0x0) {
                    auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar69 = vpcmpeqd_avx(auVar52,auVar52);
                    auVar79 = auVar79 ^ auVar69;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    auVar79 = vpcmpeqd_avx(auVar61,auVar61);
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&args);
                      auVar77 = ZEXT1664(auVar69);
                      auVar79 = vpcmpeqd_avx(auVar79,auVar79);
                    }
                    auVar69 = vpcmpeqd_avx(local_1598,_DAT_01f7aa10);
                    auVar79 = auVar69 ^ auVar79;
                    auVar62._8_4_ = 0xff800000;
                    auVar62._0_8_ = 0xff800000ff800000;
                    auVar62._12_4_ = 0xff800000;
                    auVar69 = vblendvps_avx(auVar62,*(undefined1 (*) [16])(args.ray + 0x80),auVar69)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar69;
                  }
                  auVar53._8_8_ = 0x100000001;
                  auVar53._0_8_ = 0x100000001;
                  if ((auVar53 & auVar79) != (undefined1  [16])0x0) goto LAB_005cc898;
                  *(int *)(ray + k * 4 + 0x80) = auVar77._0_4_;
                }
                uVar33 = uVar33 ^ 1L << (uVar36 & 0x3f);
              } while (uVar33 != 0);
            }
          }
        }
        local_1578 = local_1578 + 1;
        auVar77 = ZEXT3264(local_11f8);
        auVar84 = ZEXT3264(local_1218);
        auVar88 = ZEXT3264(local_1238);
        auVar93 = ZEXT3264(local_1318);
        auVar96 = ZEXT3264(local_1338);
      } while (local_1578 != local_1588);
    }
LAB_005cc882:
    bVar44 = pNVar39 != stack;
    if (!bVar44) {
      return bVar44;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }